

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem_capi.cpp
# Opt level: O0

void __thiscall rlottie::internal::renderer::SolidLayer::buildLayerNode(SolidLayer *this)

{
  iterator ppVVar1;
  LOTNode **ppLVar2;
  LOTLayerNode *pLVar3;
  vector<LOTNode_*,_std::allocator<LOTNode_*>_> *this_00;
  size_type sVar4;
  Drawable *lotDrawable;
  VDrawable **i;
  iterator __end1;
  iterator __begin1;
  DrawableList *__range1;
  DrawableList renderlist;
  value_type *in_stack_ffffffffffffff98;
  SolidLayer *in_stack_ffffffffffffffa0;
  iterator local_28;
  
  Layer::buildLayerNode((Layer *)i);
  renderList(in_stack_ffffffffffffffa0);
  Layer::cnodes((Layer *)0x178506);
  std::vector<LOTNode_*,_std::allocator<LOTNode_*>_>::clear
            ((vector<LOTNode_*,_std::allocator<LOTNode_*>_> *)0x17850e);
  local_28 = VSpan<VDrawable_*>::begin((VSpan<VDrawable_*> *)0x178522);
  ppVVar1 = VSpan<VDrawable_*>::end((VSpan<VDrawable_*> *)in_stack_ffffffffffffffa0);
  for (; local_28 != ppVVar1; local_28 = local_28 + 1) {
    Drawable::sync((Drawable *)*local_28);
    Layer::cnodes((Layer *)0x17856d);
    std::unique_ptr<LOTNode,_std::default_delete<LOTNode>_>::get
              ((unique_ptr<LOTNode,_std::default_delete<LOTNode>_> *)0x178580);
    std::vector<LOTNode_*,_std::allocator<LOTNode_*>_>::push_back
              ((vector<LOTNode_*,_std::allocator<LOTNode_*>_> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
  }
  Layer::cnodes((Layer *)0x1785ae);
  ppLVar2 = std::vector<LOTNode_*,_std::allocator<LOTNode_*>_>::data
                      ((vector<LOTNode_*,_std::allocator<LOTNode_*>_> *)0x1785b6);
  pLVar3 = Layer::clayer((Layer *)0x1785c4);
  (pLVar3->mNodeList).ptr = ppLVar2;
  this_00 = Layer::cnodes((Layer *)0x1785d6);
  sVar4 = std::vector<LOTNode_*,_std::allocator<LOTNode_*>_>::size(this_00);
  pLVar3 = Layer::clayer((Layer *)0x1785ed);
  (pLVar3->mNodeList).size = sVar4;
  return;
}

Assistant:

void renderer::SolidLayer::buildLayerNode()
{
    renderer::Layer::buildLayerNode();

    auto renderlist = renderList();

    cnodes().clear();
    for (auto &i : renderlist) {
        auto lotDrawable = static_cast<renderer::Drawable *>(i);
        lotDrawable->sync();
        cnodes().push_back(lotDrawable->mCNode.get());
    }
    clayer().mNodeList.ptr = cnodes().data();
    clayer().mNodeList.size = cnodes().size();
}